

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O2

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,DateTime *dateTime,int day)

{
  bool bVar1;
  undefined1 uVar2;
  DateTime DStack_50;
  DateTime DStack_38;
  DateTime DStack_20;
  
  if ((int)(*(uint *)(this + 0x30) & *(uint *)(this + 0x34)) < 0) {
    bVar1 = isInRange((UtcTimeOnly *)this,(UtcTimeOnly *)(this + 0x18),dateTime);
    return bVar1;
  }
  DStack_20._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
  DStack_20._8_8_ = *(undefined8 *)(this + 8);
  DStack_20.m_time = *(int64_t *)(this + 0x10);
  DStack_38._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
  DStack_38._8_8_ = *(undefined8 *)(this + 0x20);
  DStack_38.m_time = *(int64_t *)(this + 0x28);
  DStack_50._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
  DStack_50.m_date = dateTime->m_date;
  DStack_50._12_4_ = *(undefined4 *)&dateTime->field_0xc;
  DStack_50.m_time = dateTime->m_time;
  uVar2 = FIX::TimeRange::isInRange
                    (&DStack_20,&DStack_38,*(uint *)(this + 0x30),*(uint *)(this + 0x34),&DStack_50,
                     day);
  return (bool)uVar2;
}

Assistant:

bool isInRange(const DateTime &dateTime, int day) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInRange(m_startTime, m_endTime, dateTime);
    } else {
      return isInRange(m_startTime, m_endTime, m_startDay, m_endDay, dateTime, day);
    }
  }